

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::DecimalQuantity::adjustMagnitude(DecimalQuantity *this,int32_t delta)

{
  UBool UVar1;
  bool local_32;
  byte local_31;
  int32_t local_24;
  byte local_1d;
  int32_t dummy;
  bool overflow;
  DecimalQuantity *pDStack_18;
  int32_t delta_local;
  DecimalQuantity *this_local;
  
  if (this->precision == 0) {
    this_local._7_1_ = false;
  }
  else {
    dummy = delta;
    pDStack_18 = this;
    UVar1 = uprv_add32_overflow_63(this->scale,delta,&this->scale);
    local_1d = UVar1 != '\0';
    UVar1 = uprv_add32_overflow_63(this->origDelta,dummy,&this->origDelta);
    local_31 = 1;
    if (UVar1 == '\0') {
      local_31 = local_1d;
    }
    local_1d = local_31 & 1;
    local_32 = true;
    if (local_1d == 0) {
      UVar1 = uprv_add32_overflow_63(this->scale,this->precision,&local_24);
      local_32 = UVar1 != '\0';
    }
    this_local._7_1_ = local_32;
  }
  return this_local._7_1_;
}

Assistant:

bool DecimalQuantity::adjustMagnitude(int32_t delta) {
    if (precision != 0) {
        // i.e., scale += delta; origDelta += delta
        bool overflow = uprv_add32_overflow(scale, delta, &scale);
        overflow = uprv_add32_overflow(origDelta, delta, &origDelta) || overflow;
        // Make sure that precision + scale won't overflow, either
        int32_t dummy;
        overflow = overflow || uprv_add32_overflow(scale, precision, &dummy);
        return overflow;
    }
    return false;
}